

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateServiceMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  bool bVar1;
  Descriptor *pDVar2;
  string local_a0;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  pointer local_30;
  pointer pbStack_28;
  pointer local_20;
  
  io::Printer::Print<>(printer,"/**\n");
  local_80._16_8_ = &local_60;
  local_80._24_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = (pointer)0x0;
  pbStack_28 = (pointer)0x0;
  local_20 = (pointer)0x0;
  bVar1 = MethodDescriptor::GetSourceLocation(method,(SourceLocation *)local_80);
  if (bVar1) {
    GenerateDocCommentBodyForLocation(printer,(SourceLocation *)local_80,true,0);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_80);
  UnderscoresToCamelCase(&local_a0,*(string **)method,false);
  EscapePhpdoc((string *)local_80,&local_a0);
  io::Printer::Print<char[12],std::__cxx11::string>
            (printer," * Method <code>^method_name^</code>\n *\n",(char (*) [12])0x3d360f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pDVar2 = MethodDescriptor::input_type(method);
  FullClassName<google::protobuf::Descriptor>(&local_a0,pDVar2,false);
  EscapePhpdoc((string *)local_80,&local_a0);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer," * @param \\^input_type^ $request\n",(char (*) [11])"input_type",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pDVar2 = MethodDescriptor::output_type(method);
  FullClassName<google::protobuf::Descriptor>(&local_a0,pDVar2,false);
  EscapePhpdoc((string *)local_80,&local_a0);
  io::Printer::Print<char[12],std::__cxx11::string>
            (printer," * @return \\^return_type^\n */\n",(char (*) [12])"return_type",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void GenerateServiceMethodDocComment(io::Printer* printer,
                              const MethodDescriptor* method) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, method);
  printer->Print(
    " * Method <code>^method_name^</code>\n"
    " *\n",
    "method_name", EscapePhpdoc(UnderscoresToCamelCase(method->name(), false)));
  printer->Print(
    " * @param \\^input_type^ $request\n",
    "input_type", EscapePhpdoc(FullClassName(method->input_type(), false)));
  printer->Print(
    " * @return \\^return_type^\n"
    " */\n",
    "return_type", EscapePhpdoc(FullClassName(method->output_type(), false)));
}